

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O0

void S_StopSound(sector_t *sec,int channel)

{
  FSoundChan *pFVar1;
  FSoundChan *next;
  FSoundChan *chan;
  int channel_local;
  sector_t *sec_local;
  
  next = Channels;
  pFVar1 = next;
  while (next = pFVar1, next != (FSoundChan *)0x0) {
    pFVar1 = next->NextChan;
    if (((next->SourceType == '\x02') && ((next->field_12).Actor == (AActor *)sec)) &&
       (((uint)next->EntChannel == channel || ((i_compatflags & 0x20U) != 0)))) {
      S_StopChannel(next);
    }
  }
  return;
}

Assistant:

void S_StopSound (const sector_t *sec, int channel)
{
	FSoundChan *chan = Channels;
	while (chan != NULL)
	{
		FSoundChan *next = chan->NextChan;
		if (chan->SourceType == SOURCE_Sector &&
			chan->Sector == sec &&
			(chan->EntChannel == channel || (i_compatflags & COMPATF_MAGICSILENCE)))
		{
			S_StopChannel(chan);
		}
		chan = next;
	}
}